

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
     Finalize<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>>
               (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *state,
               interval_t *target,AggregateFinalizeData *finalize_data)

{
  undefined8 uVar1;
  int64_t iVar2;
  const_iterator cVar3;
  
  if (state->frequency_map != (Counts *)0x0) {
    cVar3 = ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::Scan(state);
    if (cVar3.super__Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true>
        ._M_cur != (__node_type *)0x0) {
      uVar1 = *(undefined8 *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true>
                      ._M_cur + 8);
      iVar2 = *(int64_t *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true>
                      ._M_cur + 0x10);
      target->months = (int)uVar1;
      target->days = (int)((ulong)uVar1 >> 0x20);
      target->micros = iVar2;
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}